

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O2

pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
* pstore::index::details::linear_node::get_node
            (pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
             *__return_storage_ptr__,database *db,index_pointer node)

{
  uint64_t uVar1;
  bool bVar2;
  typed_address<pstore::index::details::linear_node> tVar3;
  shared_ptr<const_pstore::index::details::linear_node> ln;
  index_pointer node_local;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  node_local = node;
  if (((ulong)node.internal_ & 2) == 0) {
    tVar3 = index_pointer::untag_address<pstore::index::details::linear_node,void>
                      ((index_pointer *)&node_local.addr_);
    database::getro<pstore::index::details::linear_node,void>
              ((database *)&ln,(typed_address<pstore::index::details::linear_node>)db);
    uVar1 = (ln.
             super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->size_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ln.
                super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    (*db->_vptr_database[2])(local_38,db,tVar3.a_.a_,uVar1 * 8 + 0x10,1,0);
    std::static_pointer_cast<pstore::index::details::linear_node_const,void_const>
              ((shared_ptr<const_void> *)&ln);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    bVar2 = std::operator!=(&(ln.
                              super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->signature_,(array<unsigned_char,_8UL> *)&node_signature_);
    if (bVar2) {
      raise<pstore::error_code>(index_corrupt);
    }
    std::__shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
                  *)__return_storage_ptr__,
                 &ln.
                  super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
                );
    __return_storage_ptr__->second =
         ln.
         super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ln.
                super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    bVar2 = std::operator==(&(node.linear_ & 0xfffffffffffffffcU)->signature_,
                            (array<unsigned_char,_8UL> *)&node_signature_);
    if (!bVar2) {
      assert_failed("ptr->signature_ == node_signature_",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                    ,0x7d);
    }
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (__return_storage_ptr__->first).
    super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->second = node.linear_ & 0xfffffffffffffffcU;
  }
  return __return_storage_ptr__;
}

Assistant:

auto linear_node::get_node (database const & db, index_pointer const node)
                -> std::pair<std::shared_ptr<linear_node const>, linear_node const *> {

                if (node.is_heap ()) {
                    auto const * ptr = node.untag<linear_node const *> ();
                    PSTORE_ASSERT (ptr->signature_ == node_signature_);
                    return {nullptr, ptr};
                }

                // Read an existing node. First work out its size.
                auto const addr = node.untag_address<linear_node> ();
                std::size_t const in_store_size =
                    linear_node::size_bytes (db.getro (addr)->size ());

                // Now access the data block for this linear node. We need to use the "raw address"
                // version of getro() because in_store_size is a number of bytes, not a number of
                // instances of linear_node.
                auto const ln = std::static_pointer_cast<linear_node const> (
                    db.getro (addr.to_address (), in_store_size));
#if PSTORE_SIGNATURE_CHECKS_ENABLED
                if (ln->signature_ != node_signature_) {
                    raise (pstore::error_code::index_corrupt);
                }
#endif
                auto const * const p = ln.get ();
                return {std::move (ln), p};
            }